

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O0

char dspl_Victory(void)

{
  int iVar1;
  undefined4 local_1c;
  undefined4 local_18;
  int i;
  int sleepTime;
  char key;
  int maxX;
  
  if (_stdscr == 0) {
    local_1c = -1;
  }
  else {
    local_1c = *(short *)(_stdscr + 4) + 1;
  }
  i._3_1_ = '\0';
  cbreak();
  nodelay(_stdscr,1);
  FlyingCard.m_enabled = true;
  do {
    if ('\0' < i._3_1_) {
      FlyingCard.m_enabled = false;
      nodelay(_stdscr,0);
      return i._3_1_;
    }
    ResetFlying(local_1c);
    iVar1 = rand();
    for (local_18 = 0; local_18 < local_1c + 7; local_18 = local_18 + 1) {
      MoveFlying();
      dspl_Render(CMD_NONE);
      SleepMs(iVar1 % 0x32 + 10);
      i._3_1_ = input_ReadKey();
      if (i._3_1_ != '\0') break;
    }
  } while( true );
}

Assistant:

char dspl_Victory(void)
{
  int maxX = getmaxy(stdscr);
  char key = 0;

  cbreak();
  nodelay(stdscr, TRUE);

  FlyingCard.m_enabled = true;
  while (key <= 0) {
    ResetFlying(maxX);
    int sleepTime = (rand() % 50) + 10;
    for (int i = 0; i < (maxX + CARD_HEIGHT); i++) {
      MoveFlying();
      dspl_Render(CMD_NONE);
      SleepMs(sleepTime);

      key = input_ReadKey();
      if (key) {
        break;
      }
    }
  }
  FlyingCard.m_enabled = false;

  nodelay(stdscr, FALSE);

  return key;
}